

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> __thiscall
google::protobuf::internal::ExtensionSet::Insert(ExtensionSet *this,int key)

{
  bool bVar1;
  pointer ppVar2;
  KeyValue *pKVar3;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  int in_ESI;
  value_type *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  pVar4;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar5;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar6;
  KeyValue *it;
  KeyValue *end;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_bool>
  maybe;
  KeyValue *in_stack_ffffffffffffff10;
  KeyValue *in_stack_ffffffffffffff20;
  bool local_c9;
  Extension *local_c8;
  anon_union_8_21_eb924b1f_for_Extension_0 local_c0;
  undefined8 local_b8;
  FieldDescriptor *local_b0;
  bool local_a1;
  Extension *local_a0 [2];
  KeyValue *local_90;
  KeyValue *local_88;
  Extension *local_80;
  _Base_ptr local_78;
  undefined1 local_70;
  anon_union_8_21_eb924b1f_for_Extension_0 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  pair<const_int,_google::protobuf::internal::ExtensionSet::Extension> local_50;
  _Base_ptr local_30;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> local_10;
  
  bVar1 = is_large((ExtensionSet *)in_RDI);
  if (bVar1) {
    local_68.int64_value = 0;
    uStack_60 = 0;
    local_58 = 0;
    std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>::
    pair<int_&,_google::protobuf::internal::ExtensionSet::Extension,_true>
              (&local_50,(int *)&stack0xffffffffffffffe4,(Extension *)&local_68);
    pVar4 = std::
            map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
            ::insert((map<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                      *)in_stack_ffffffffffffff20,in_RDI);
    local_78 = (_Base_ptr)pVar4.first._M_node;
    local_70 = pVar4.second;
    local_30 = local_78;
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                           *)0x48d26f);
    local_80 = &ppVar2->second;
    std::pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool>::
    pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool_&,_true>
              (&local_10,&local_80,(bool *)&stack0xffffffffffffffd8);
    pVar5._8_8_ = extraout_RDX;
    pVar5.first = local_10.first;
  }
  else {
    local_88 = flat_end((ExtensionSet *)in_RDI);
    pKVar3 = flat_begin((ExtensionSet *)in_RDI);
    local_90 = std::
               lower_bound<google::protobuf::internal::ExtensionSet::KeyValue*,int,google::protobuf::internal::ExtensionSet::KeyValue::FirstComparator>
                         (pKVar3,local_88,&stack0xffffffffffffffe4);
    if ((local_90 == local_88) || (local_90->first != in_ESI)) {
      if (*(ushort *)((long)&(((KeyValue *)in_RDI)->second).field_0 + 2) <
          *(ushort *)&(((KeyValue *)in_RDI)->second).field_0) {
        std::
        copy_backward<google::protobuf::internal::ExtensionSet::KeyValue*,google::protobuf::internal::ExtensionSet::KeyValue*>
                  (in_stack_ffffffffffffff20,(KeyValue *)in_RDI,in_stack_ffffffffffffff10);
        *(short *)((long)&(((KeyValue *)in_RDI)->second).field_0 + 2) =
             *(short *)((long)&(((KeyValue *)in_RDI)->second).field_0 + 2) + 1;
        local_90->first = in_ESI;
        memset(&local_c0,0,0x18);
        (local_90->second).field_0 = local_c0;
        (local_90->second).type = (undefined1)local_b8;
        (local_90->second).is_repeated = (bool)local_b8._1_1_;
        (local_90->second).field_0xa = local_b8._2_1_;
        (local_90->second).is_packed = (bool)local_b8._3_1_;
        (local_90->second).cached_size = local_b8._4_4_;
        (local_90->second).descriptor = local_b0;
        local_c8 = &local_90->second;
        local_c9 = true;
        std::pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool>::
        pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool,_true>
                  (&local_10,&local_c8,&local_c9);
        pVar5._8_8_ = extraout_RDX_01;
        pVar5.first = local_10.first;
      }
      else {
        GrowCapacity((ExtensionSet *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                     CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
        pVar5 = Insert((ExtensionSet *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffdc);
        local_10.second = pVar5.second;
      }
    }
    else {
      local_a0[0] = &local_90->second;
      local_a1 = false;
      std::pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool>::
      pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool,_true>
                (&local_10,local_a0,&local_a1);
      pVar5._8_8_ = extraout_RDX_00;
      pVar5.first = local_10.first;
    }
  }
  local_10.first = pVar5.first;
  pVar6._9_7_ = pVar5._9_7_;
  pVar6.second = local_10.second;
  pVar6.first = local_10.first;
  return pVar6;
}

Assistant:

std::pair<ExtensionSet::Extension*, bool> ExtensionSet::Insert(int key) {
  if (PROTOBUF_PREDICT_FALSE(is_large())) {
    auto maybe = map_.large->insert({key, Extension()});
    return {&maybe.first->second, maybe.second};
  }
  KeyValue* end = flat_end();
  KeyValue* it =
      std::lower_bound(flat_begin(), end, key, KeyValue::FirstComparator());
  if (it != end && it->first == key) {
    return {&it->second, false};
  }
  if (flat_size_ < flat_capacity_) {
    std::copy_backward(it, end, end + 1);
    ++flat_size_;
    it->first = key;
    it->second = Extension();
    return {&it->second, true};
  }
  GrowCapacity(flat_size_ + 1);
  return Insert(key);
}